

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_strncasecmp(char *s1,char *s2,size_t n)

{
  int iVar1;
  __int32_t **pp_Var2;
  long lVar3;
  bool bVar4;
  
  if (n == 0) {
    return 0;
  }
  pp_Var2 = __ctype_tolower_loc();
  lVar3 = 0;
  while( true ) {
    iVar1 = (*pp_Var2)[(byte)s1[lVar3]] - (*pp_Var2)[(byte)s2[lVar3]];
    if (iVar1 != 0) {
      return iVar1;
    }
    if (s1[lVar3] == 0) break;
    bVar4 = n - 1 == lVar3;
    lVar3 = lVar3 + 1;
    if (bVar4) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int arg_strncasecmp(const char * s1, const char * s2, size_t n) {
	if (n != 0) {
		const unsigned char * us1 = (const unsigned char *)s1;
		const unsigned char * us2 = (const unsigned char *)s2;

		do {
			if (tolower(*us1) != tolower(*us2++)) {
				return tolower(*us1) - tolower(*--us2);
			}

			if (*us1++ == '\0') {
				break;
			}
		} while (--n != 0);
	}

	return 0;
}